

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int genaNotifyAllExt(UpnpDevice_Handle device_handle,char *UDN,char *servId,IXML_Document *PropSet)

{
  char *propertySet_00;
  undefined8 in_R9;
  char *propertySet;
  int line;
  int ret;
  IXML_Document *PropSet_local;
  char *servId_local;
  char *UDN_local;
  UpnpDevice_Handle device_handle_local;
  
  propertySet._0_4_ = 0;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3ce,"GENA BEGIN NOTIFY ALL EXT\n",in_R9
             ,0);
  propertySet_00 = (char *)ixmlPrintNode(PropSet);
  if (propertySet_00 == (char *)0x0) {
    propertySet._0_4_ = 0x3d3;
    propertySet._4_4_ = 0xffffff9b;
  }
  else {
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3da,
               "GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",propertySet_00);
    propertySet._4_4_ = genaNotifyAllCommon(device_handle,UDN,servId,propertySet_00);
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",(int)propertySet,
             "GENA END NOTIFY ALL EXT, ret = %d\n",(ulong)propertySet._4_4_);
  return propertySet._4_4_;
}

Assistant:

int genaNotifyAllExt(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	IXML_Document *PropSet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL EXT\n");

	propertySet = ixmlPrintNode((IXML_Node *)PropSet);
	if (propertySet == NULL) {
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",
		propertySet);

	ret = genaNotifyAllCommon(device_handle, UDN, servId, propertySet);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL EXT, ret = %d\n",
		ret);

	return ret;
}